

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_colorspace_set_xy_and_XYZ
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_xy *xy,png_XYZ *XYZ,
              int preferred)

{
  png_fixed_point pVar1;
  int iVar2;
  int preferred_local;
  png_XYZ *XYZ_local;
  png_xy *xy_local;
  png_colorspacerp colorspace_local;
  png_const_structrp png_ptr_local;
  
  if ((colorspace->flags & 0x8000) != 0) {
    return 0;
  }
  if ((preferred < 2) && ((colorspace->flags & 2) != 0)) {
    iVar2 = png_colorspace_endpoints_match(xy,&colorspace->end_points_xy,100);
    if (iVar2 == 0) {
      colorspace->flags = colorspace->flags | 0x8000;
      png_benign_error(png_ptr,"inconsistent chromaticities");
      return 0;
    }
    if (preferred == 0) {
      return 1;
    }
  }
  pVar1 = xy->redy;
  (colorspace->end_points_xy).redx = xy->redx;
  (colorspace->end_points_xy).redy = pVar1;
  pVar1 = xy->greeny;
  (colorspace->end_points_xy).greenx = xy->greenx;
  (colorspace->end_points_xy).greeny = pVar1;
  pVar1 = xy->bluey;
  (colorspace->end_points_xy).bluex = xy->bluex;
  (colorspace->end_points_xy).bluey = pVar1;
  pVar1 = xy->whitey;
  (colorspace->end_points_xy).whitex = xy->whitex;
  (colorspace->end_points_xy).whitey = pVar1;
  memcpy(&colorspace->end_points_XYZ,XYZ,0x24);
  colorspace->flags = colorspace->flags | 2;
  iVar2 = png_colorspace_endpoints_match(xy,&sRGB_xy,1000);
  if (iVar2 == 0) {
    colorspace->flags = colorspace->flags & 0xffbf;
  }
  else {
    colorspace->flags = colorspace->flags | 0x40;
  }
  return 2;
}

Assistant:

static int
png_colorspace_set_xy_and_XYZ(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_xy *xy, const png_XYZ *XYZ,
    int preferred)
{
   if ((colorspace->flags & PNG_COLORSPACE_INVALID) != 0)
      return 0;

   /* The consistency check is performed on the chromaticities; this factors out
    * variations because of the normalization (or not) of the end point Y
    * values.
    */
   if (preferred < 2 &&
       (colorspace->flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* The end points must be reasonably close to any we already have.  The
       * following allows an error of up to +/-.001
       */
      if (png_colorspace_endpoints_match(xy, &colorspace->end_points_xy,
          100) == 0)
      {
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "inconsistent chromaticities");
         return 0; /* failed */
      }

      /* Only overwrite with preferred values */
      if (preferred == 0)
         return 1; /* ok, but no change */
   }

   colorspace->end_points_xy = *xy;
   colorspace->end_points_XYZ = *XYZ;
   colorspace->flags |= PNG_COLORSPACE_HAVE_ENDPOINTS;

   /* The end points are normally quoted to two decimal digits, so allow +/-0.01
    * on this test.
    */
   if (png_colorspace_endpoints_match(xy, &sRGB_xy, 1000) != 0)
      colorspace->flags |= PNG_COLORSPACE_ENDPOINTS_MATCH_sRGB;

   else
      colorspace->flags &= PNG_COLORSPACE_CANCEL(
         PNG_COLORSPACE_ENDPOINTS_MATCH_sRGB);

   return 2; /* ok and changed */
}